

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_abstract.c
# Opt level: O0

TA_RetCode TA_SetOutputParamIntegerPtr(TA_ParamHolder *param,uint paramIndex,TA_Integer *out)

{
  int *piVar1;
  int *piVar2;
  TA_FuncInfo *funcInfo;
  TA_OutputParameterInfo *paramInfo;
  TA_ParamHolderPriv *paramHolderPriv;
  TA_Integer *out_local;
  uint paramIndex_local;
  TA_ParamHolder *param_local;
  TA_RetCode local_4;
  
  if ((param == (TA_ParamHolder *)0x0) || (out == (TA_Integer *)0x0)) {
    local_4 = TA_BAD_PARAM;
  }
  else {
    piVar1 = (int *)param->hiddenData;
    if (*piVar1 == -0x5dfd4dfe) {
      if (*(long *)(piVar1 + 10) == 0) {
        local_4 = TA_INVALID_HANDLE;
      }
      else if (paramIndex < *(uint *)(*(long *)(piVar1 + 10) + 0x2c)) {
        piVar2 = *(int **)(*(long *)(piVar1 + 6) + (ulong)paramIndex * 0x10 + 8);
        if (piVar2 == (int *)0x0) {
          local_4 = TA_INTERNAL_ERROR|TA_BAD_PARAM;
        }
        else if (*piVar2 == 1) {
          *(TA_Integer **)(*(long *)(piVar1 + 6) + (ulong)paramIndex * 0x10) = out;
          piVar1[9] = (1 << ((byte)paramIndex & 0x1f) ^ 0xffffffffU) & piVar1[9];
          local_4 = TA_SUCCESS;
        }
        else {
          local_4 = TA_INVALID_PARAM_HOLDER_TYPE;
        }
      }
      else {
        local_4 = TA_BAD_PARAM;
      }
    }
    else {
      local_4 = TA_INVALID_PARAM_HOLDER;
    }
  }
  return local_4;
}

Assistant:

TA_RetCode TA_SetOutputParamIntegerPtr( TA_ParamHolder *param,
                                        unsigned int paramIndex,
                                        TA_Integer     *out )
{
   TA_ParamHolderPriv *paramHolderPriv;
   const TA_OutputParameterInfo *paramInfo;
   const TA_FuncInfo *funcInfo;

   if( (param == NULL) || (out == NULL) )
   {
      return TA_BAD_PARAM;
   }

   paramHolderPriv = (TA_ParamHolderPriv *)(param->hiddenData);
   if( paramHolderPriv->magicNumber != TA_PARAM_HOLDER_PRIV_MAGIC_NB )
   {
      return TA_INVALID_PARAM_HOLDER;
   }

   /* Make sure this index really exist. */
   funcInfo = paramHolderPriv->funcInfo;
   if( !funcInfo ) return TA_INVALID_HANDLE;

   if( paramIndex >= funcInfo->nbOutput )
   {
      return TA_BAD_PARAM;
   }

   /* Verify the type of the parameter. */
   paramInfo = paramHolderPriv->out[paramIndex].outputInfo;
   if( !paramInfo ) return TA_INTERNAL_ERROR(2);
   if( paramInfo->type != TA_Output_Integer )
   {
      return TA_INVALID_PARAM_HOLDER_TYPE;
   }

   /* keep a copy of the provided parameter. */
   paramHolderPriv->out[paramIndex].data.outInteger = out;

   /* This parameter is now initialized, clear the corresponding bit. */
   paramHolderPriv->outBitmap &= ~(1<<paramIndex);

   return TA_SUCCESS;
}